

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_suba_32_pcix(void)

{
  uint uVar1;
  uint *r_dst;
  uint src;
  
  uVar1 = OPER_PCIX_32();
  m68ki_cpu.dar[(ulong)(m68ki_cpu.ir >> 9 & 7) + 8] =
       m68ki_cpu.dar[(ulong)(m68ki_cpu.ir >> 9 & 7) + 8] - uVar1;
  return;
}

Assistant:

static void m68k_op_suba_32_pcix(void)
{
	uint src = OPER_PCIX_32();
	uint* r_dst = &AX;

	*r_dst = MASK_OUT_ABOVE_32(*r_dst - src);
}